

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void main_loop(GPU_Target *screen)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  SDL_Event event;
  int local_60 [5];
  int local_4c;
  
  bVar2 = false;
  bVar1 = false;
  do {
    iVar3 = SDL_PollEvent(local_60);
    while (iVar3 != 0) {
      bVar1 = true;
      if ((local_60[0] != 0x100) && (bVar1 = bVar2, local_4c == 0x1b && local_60[0] == 0x300)) {
        bVar1 = true;
      }
      iVar3 = SDL_PollEvent(local_60);
      bVar2 = bVar1;
    }
    GPU_Clear(screen);
    GPU_Flip(screen);
  } while (!bVar1);
  return;
}

Assistant:

void main_loop(GPU_Target* screen)
{
    Uint8 done;
    SDL_Event event;
    
    done = 0;
    while(!done)
    {
        while(SDL_PollEvent(&event))
        {
            if(event.type == SDL_QUIT)
                done = 1;
            else if(event.type == SDL_KEYDOWN)
            {
                if(event.key.keysym.sym == SDLK_ESCAPE)
                    done = 1;
            }
        }
        
        // Update logic here
        
        GPU_Clear(screen);
        
        // Draw stuff here
        
        GPU_Flip(screen);
    }
}